

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O2

void rw::d3d8::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  ushort uVar1;
  uint32 uVar2;
  Geometry *pGVar3;
  MeshHeader *pMVar4;
  InstanceDataHeader *pIVar5;
  uint32 *minVert;
  void *indexBuffer;
  uint16 *__dest;
  ulong uVar6;
  uint32 i;
  uint uVar7;
  MeshHeader *pMVar8;
  ulong uVar9;
  
  pGVar3 = atomic->geometry;
  if (pGVar3->instData == (InstanceDataHeader *)0x0) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp line: 260"
    ;
    pIVar5 = (InstanceDataHeader *)(*DAT_00143848)(0x10,0x3000f);
    pMVar4 = pGVar3->meshHeader;
    pGVar3->instData = pIVar5;
    pIVar5->platform = 8;
    *(uint16 *)&pIVar5[1].platform = pMVar4->serialNum;
    uVar1 = pMVar4->numMeshes;
    *(ushort *)((long)&pIVar5[1].platform + 2) = uVar1;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp line: 267"
    ;
    minVert = (uint32 *)(*DAT_00143848)((ulong)uVar1 * 0x38,0x3000f);
    *(uint32 **)(pIVar5 + 2) = minVert;
    pMVar8 = pMVar4 + 1;
    for (uVar7 = 0; uVar7 < *(ushort *)((long)&pIVar5[1].platform + 2); uVar7 = uVar7 + 1) {
      findMinVertAndNumVertices
                (*(uint16 **)pMVar8,pMVar8->totalIndices,minVert,(int32 *)(minVert + 2));
      uVar2 = pMVar8->totalIndices;
      minVert[3] = uVar2;
      *(long *)(minVert + 4) = *(long *)(pMVar8 + 1);
      minVert[6] = 0;
      minVert[7] = pMVar4->flags == 1 | 4;
      minVert[10] = 0;
      minVert[0xb] = 0;
      *(undefined8 *)((long)minVert + 0x2f) = 0;
      indexBuffer = d3d::createIndexBuffer(uVar2 * 2,false);
      *(void **)(minVert + 8) = indexBuffer;
      __dest = d3d::lockIndices(indexBuffer,0,0,0);
      uVar2 = *minVert;
      if (uVar2 == 0) {
        memcpy(__dest,*(void **)pMVar8,(long)(int)minVert[3] * 2);
      }
      else {
        uVar6 = (ulong)minVert[3];
        if ((int)minVert[3] < 1) {
          uVar6 = 0;
        }
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          __dest[uVar9] = *(short *)(*(long *)pMVar8 + uVar9 * 2) - (short)uVar2;
        }
      }
      d3d::unlockIndices(*(void **)(minVert + 8));
      (**(code **)&rwpipe[1].super_Pipeline)(pGVar3,minVert);
      pMVar8 = (MeshHeader *)&pMVar8[1].totalIndices;
      minVert = minVert + 0xe;
    }
  }
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// TODO: allow for REINSTANCE
	if(geo->instData)
		return;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	MeshHeader *meshh = geo->meshHeader;
	geo->instData = header;
	header->platform = PLATFORM_D3D8;

	header->serialNumber = meshh->serialNum;
	header->numMeshes = meshh->numMeshes;
	header->inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);

	InstanceData *inst = header->inst;
	Mesh *mesh = meshh->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		findMinVertAndNumVertices(mesh->indices, mesh->numIndices,
		                          &inst->minVert, &inst->numVertices);
		inst->numIndices = mesh->numIndices;
		inst->material = mesh->material;
		inst->vertexShader = 0;
		inst->primType = meshh->flags == 1 ? D3DPT_TRIANGLESTRIP : D3DPT_TRIANGLELIST;
		inst->vertexBuffer = nil;
		inst->baseIndex = 0;	// (maybe) not used by us
		inst->vertexAlpha = 0;
		inst->managed = 0;
		inst->remapped = 0;

		inst->indexBuffer = createIndexBuffer(inst->numIndices*2, false);
		uint16 *indices = lockIndices(inst->indexBuffer, 0, 0, 0);
		if(inst->minVert == 0)
			memcpy(indices, mesh->indices, inst->numIndices*2);
		else
			for(int32 j = 0; j < inst->numIndices; j++)
				indices[j] = mesh->indices[j] - inst->minVert;
		unlockIndices(inst->indexBuffer);

		pipe->instanceCB(geo, inst);
		mesh++;
		inst++;
	}
}